

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool feintrack::is_intersect
               (float_t x1_1,float_t y1_1,float_t x2_1,float_t y2_1,float_t x1_2,float_t y1_2,
               float_t x2_2,float_t y2_2)

{
  byte bVar1;
  float_t fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (1e-05 <= ABS(x1_1 - x2_1)) {
    fVar3 = (y2_1 - y1_1) / (x2_1 - x1_1);
    fVar4 = (x2_1 * y1_1 - x1_1 * y2_1) / (x2_1 - x1_1);
    fVar5 = x1_2;
    if (1e-05 <= ABS(x1_2 - x2_2)) goto LAB_00119c93;
LAB_00119d0d:
    fVar6 = fVar3 * fVar5 + fVar4;
  }
  else {
    fVar4 = 0.0;
    fVar3 = 0.0;
    if (ABS(x1_2 - x2_2) < 1e-05) {
      bVar1 = ABS(x1_1 - x1_2) < 1e-05;
      goto LAB_00119da6;
    }
LAB_00119c93:
    fVar5 = (y2_2 - y1_2) / (x2_2 - x1_2);
    fVar6 = (x2_2 * y1_2 - x1_2 * y2_2) / (x2_2 - x1_2);
    if (1e-05 <= ABS(x1_1 - x2_1)) {
      fVar5 = fVar5 - fVar3;
      if (ABS(fVar5) <= 1e-05) {
        bVar1 = 0;
        goto LAB_00119da6;
      }
      fVar5 = (fVar4 - fVar6) / fVar5;
      goto LAB_00119d0d;
    }
    fVar6 = fVar5 * x1_1 + fVar6;
    fVar5 = x1_1;
  }
  fVar2 = x2_1;
  if (x1_1 <= x2_1) {
    fVar2 = x1_1;
  }
  bVar1 = 0;
  if (fVar2 <= fVar5) {
    if (x2_1 <= x1_1) {
      x2_1 = x1_1;
    }
    bVar1 = 0;
    if (fVar5 <= x2_1 + 1e-05) {
      fVar2 = x2_2;
      if (x1_2 <= x2_2) {
        fVar2 = x1_2;
      }
      bVar1 = 0;
      if (fVar2 <= fVar5) {
        if (x2_2 <= x1_2) {
          x2_2 = x1_2;
        }
        if (fVar5 <= x2_2 + 1e-05) {
          fVar2 = y2_1;
          if (y1_1 <= y2_1) {
            fVar2 = y1_1;
          }
          bVar1 = 0;
          if (fVar2 <= fVar6) {
            if (y2_1 <= y1_1) {
              y2_1 = y1_1;
            }
            if (fVar6 <= y2_1 + 1e-05) {
              fVar2 = y2_2;
              if (y1_2 <= y2_2) {
                fVar2 = y1_2;
              }
              if (y2_2 <= y1_2) {
                y2_2 = y1_2;
              }
              bVar1 = -(fVar6 <= y2_2 + 1e-05) & -(fVar2 <= fVar6);
            }
          }
        }
      }
    }
  }
LAB_00119da6:
  return (bool)(bVar1 & 1);
}

Assistant:

bool is_intersect(float_t x1_1, float_t y1_1, float_t x2_1, float_t y2_1,
		float_t x1_2, float_t y1_2, float_t x2_2, float_t y2_2)
	{
		const float_t eps = 0.00001f; //Константа для сравнения на равентсво

		//Получение уравнения прямой, содержащей 1-й отрезок
		float_t a1(0), b1(0); //Коэффициенты 1-й прямой
		bool trivial1(false); //Вырожденный случай - прямая перпендикулярна оси OX

        if (fabs(x1_1 - x2_1) < eps)
		{
			trivial1 = true;
		}
		else
		{
			a1 = (y2_1 - y1_1) / (x2_1 - x1_1);
			b1 = (x2_1 * y1_1 - x1_1 * y2_1) / (x2_1 - x1_1);
		}

		//Получение уравнения прямой, содержащей 2-й отрезок
		float_t a2(0), b2(0); //Коэффициенты 2-й прямой
		bool trivial2(false); //Вырожденный случай - прямая перпендикулярна оси OX

        if (fabs(x1_2 - x2_2) < eps) //Вырожденный случай - прямая перпендикулярна оси OX
		{
			trivial2 = true;
		}
		else
		{
			a2 = (y2_2 - y1_2) / (x2_2 - x1_2);
			b2 = (x2_2 * y1_2 - x1_2 * y2_2) / (x2_2 - x1_2);
		}

		//Определение координат пересечения прямых
		float_t x(0), y(0);

		if (trivial1)
		{
			if (trivial2)
                return (fabs(x1_1 - x1_2) < eps);
			else
				x = x1_1;
			y = a2 * x + b2;
		}
		else
		{
			if (trivial2)
			{
				x = x1_2;
			}
			else
			{
                if (fabs(a2 - a1) > eps)
					x = (b1 - b2) / (a2 - a1);
				else
					return false;
			}
			y = a1 * x + b1;
		}

		return in_range(x, std::min(x1_1, x2_1), std::max(x1_1, x2_1) + eps) && in_range(x, std::min(x1_2, x2_2), std::max(x1_2, x2_2) + eps)
			   &&
			   in_range(y, std::min(y1_1, y2_1), std::max(y1_1, y2_1) + eps) && in_range(y, std::min(y1_2, y2_2), std::max(y1_2, y2_2) + eps);
	}